

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

fp fmt::v5::internal::get_cached_power(int min_exponent,int *pow10_exponent)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  fp fVar4;
  
  dVar3 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  uVar1 = (int)dVar3 + 0x15b;
  uVar2 = (int)dVar3 + 0x162;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  *pow10_exponent = (uVar2 & 0xfffffff8) - 0x154;
  fVar4.e = (int)*(short *)(basic_data<void>::POW10_EXPONENTS + (long)((int)uVar2 >> 3) * 2 + 2);
  fVar4.f = *(undefined8 *)(basic_data<void>::POW10_SIGNIFICANDS + (long)((int)uVar2 >> 3) * 8 + 8);
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

FMT_FUNC fp get_cached_power(int min_exponent, int &pow10_exponent) {
  const double one_over_log2_10 = 0.30102999566398114;  // 1 / log2(10)
  int index = static_cast<int>(std::ceil(
        (min_exponent + fp::significand_size - 1) * one_over_log2_10));
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  return fp(data::POW10_SIGNIFICANDS[index], data::POW10_EXPONENTS[index]);
}